

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

void cards_printAsDeck(Card **cards,uchar cardsCount)

{
  byte in_SIL;
  long in_RDI;
  uchar i;
  byte local_a;
  
  printf("[");
  for (local_a = 0; local_a < in_SIL; local_a = local_a + 1) {
    if (local_a != 0) {
      printf(",");
    }
    printf("\"%d%c\"",(ulong)**(byte **)(in_RDI + (ulong)local_a * 8),
           (ulong)(uint)(int)"cdhs"[*(byte *)(*(long *)(in_RDI + (ulong)local_a * 8) + 1)]);
  }
  printf("]");
  return;
}

Assistant:

void cards_printAsDeck(Card ** cards, unsigned char cardsCount)
{
	unsigned char i;
	printf("[");
	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			printf(",");

		printf("\"%d%c\"", cards[i]->rank, SUIT_CHAR[cards[i]->suit]);
	}
	printf("]");
}